

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

TSRange * ts_tree_get_changed_ranges(TSTree *self,TSTree *other,uint32_t *count)

{
  SubtreeHeapData *pSVar1;
  TSNode node;
  TSNode node_00;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  TSNode root;
  TSRange *result;
  TreeCursor local_88;
  TreeCursor local_68;
  TSRange *local_50;
  TSRangeArray local_48;
  
  local_68.stack.size = 0;
  local_68.stack.capacity = 0;
  local_68.tree = (TSTree *)0x0;
  local_68.stack.contents = (TreeCursorEntry *)0x0;
  local_88.stack.size = 0;
  local_88.stack.capacity = 0;
  local_88.tree = (TSTree *)0x0;
  local_88.stack.contents = (TreeCursorEntry *)0x0;
  pSVar1 = (self->root).ptr;
  if (((ulong)pSVar1 & 1) == 0) {
    uVar3._0_4_ = (pSVar1->padding).bytes;
    uVar3._4_4_ = (pSVar1->padding).extent.row;
    uVar2 = (pSVar1->padding).extent.column;
    uVar4 = uVar3._4_4_;
  }
  else {
    uVar3 = (ulong)((uint)((ulong)pSVar1 >> 0x10) & 0xff);
    uVar4 = (uint)((ulong)pSVar1 >> 0x20);
    uVar2 = uVar4 & 0xff;
    uVar4 = uVar4 >> 8 & 0xf;
  }
  node.context[1] = uVar4;
  node.context[0] = (int)uVar3;
  node.context[2] = uVar2;
  node.context[3] = 0;
  node.id = self;
  node.tree = self;
  ts_tree_cursor_init(&local_68,node);
  node_00.context[1] = uVar4;
  node_00.context[0] = (int)uVar3;
  node_00.context[2] = uVar2;
  node_00.context[3] = 0;
  node_00.id = self;
  node_00.tree = self;
  ts_tree_cursor_init(&local_88,node_00);
  local_48.contents = (TSRange *)0x0;
  local_48.size = 0;
  local_48.capacity = 0;
  ts_range_array_get_changed_ranges
            (self->included_ranges,self->included_range_count,other->included_ranges,
             other->included_range_count,&local_48);
  uVar2 = ts_subtree_get_changed_ranges
                    (&self->root,&other->root,&local_68,&local_88,self->language,&local_48,&local_50
                    );
  *count = uVar2;
  free(local_48.contents);
  free(local_68.stack.contents);
  free(local_88.stack.contents);
  return local_50;
}

Assistant:

TSRange *ts_tree_get_changed_ranges(const TSTree *self, const TSTree *other, uint32_t *count) {
  TSRange *result;
  TreeCursor cursor1 = {NULL, array_new()};
  TreeCursor cursor2 = {NULL, array_new()};
  TSNode root = ts_tree_root_node(self);
  ts_tree_cursor_init(&cursor1, root);
  ts_tree_cursor_init(&cursor2, root);

  TSRangeArray included_range_differences = array_new();
  ts_range_array_get_changed_ranges(
    self->included_ranges, self->included_range_count,
    other->included_ranges, other->included_range_count,
    &included_range_differences
  );

  *count = ts_subtree_get_changed_ranges(
    &self->root, &other->root, &cursor1, &cursor2,
    self->language, &included_range_differences, &result
  );

  array_delete(&included_range_differences);
  array_delete(&cursor1.stack);
  array_delete(&cursor2.stack);
  return result;
}